

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_assignment_operator_list_Test::~ObjectTest_basic_assignment_operator_list_Test
          (ObjectTest_basic_assignment_operator_list_Test *this)

{
  ObjectTest_basic_assignment_operator_list_Test *this_local;
  
  ~ObjectTest_basic_assignment_operator_list_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_assignment_operator_list) {
	object obj;

	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<bool>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<signed char>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<unsigned char>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<short>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<int>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<long>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<long long>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<intmax_t>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<float>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<double>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<long double>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<std::u8string>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::list<object>);
}